

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<float_const&,float_const&,pbrt::FilmHandle_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
               (string *s,char *fmt,float *v,float *args,FilmHandle *args_1,char **args_2,
               Vector3<float> *args_3,Vector3<float> *args_4,Vector3<float> *args_5,
               Vector3<float> *args_6)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *in_RCX;
  string *in_RDX;
  Vector3<float> *unaff_RBX;
  string *in_RDI;
  float *in_R8;
  FilmHandle *in_R9;
  Vector3<float> *unaff_retaddr;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd80;
  char **in_stack_fffffffffffffd88;
  char **in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  string local_260 [32];
  undefined8 local_240;
  string local_238 [32];
  stringstream local_218 [16];
  char *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  char *in_stack_fffffffffffffe08;
  LogLevel in_stack_fffffffffffffe14;
  float in_stack_fffffffffffffe5c;
  string local_90 [53];
  byte local_5b;
  byte local_5a;
  byte local_59;
  string local_58 [16];
  Vector3<float> *in_stack_ffffffffffffffb8;
  char **in_stack_ffffffffffffffc0;
  
  copyToFormatString(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  lVar2 = std::__cxx11::string::find((char)local_58,0x2a);
  local_59 = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_58,0x73);
  local_5a = lVar2 != -1;
  lVar2 = std::__cxx11::string::find((char)local_58,100);
  local_5b = lVar2 != -1;
  if ((local_59 & 1) != 0) {
    LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
             in_stack_fffffffffffffdf8);
  }
  bVar1 = std::operator==(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if ((bVar1) ||
     (bVar1 = std::operator==(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58), bVar1)) {
    FloatToString_abi_cxx11_(in_stack_fffffffffffffe5c);
    std::__cxx11::string::operator+=(in_RDI,local_90);
    std::__cxx11::string::~string(local_90);
  }
  else {
    if ((local_5b & 1) != 0) {
      LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
               in_stack_fffffffffffffdf8);
    }
    if ((local_5a & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe14,in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                 in_stack_fffffffffffffdf8);
      }
      std::__cxx11::string::c_str();
      formatOne<float_const&>(in_stack_fffffffffffffd98,(float *)in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_218);
      std::ostream::operator<<(&stack0xfffffffffffffdf8,*(float *)in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_240 = std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      std::__cxx11::string::operator+=(in_RDI,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::stringstream::~stringstream(local_218);
    }
  }
  stringPrintfRecursive<float_const&,pbrt::FilmHandle_const&,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&>
            (in_RDX,in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (Vector3<float> *)in_RDI,unaff_RBX,unaff_retaddr);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}